

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

uint * __thiscall
Fossilize::StateRecorder::Impl::copy<unsigned_int>
          (Impl *this,uint *src,size_t count,ScratchAllocator *alloc)

{
  uint *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  uint *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<unsigned_int>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<unsigned_int_const*,unsigned_int*>(src,src + count,(uint *)this_local);
    }
  }
  return (uint *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}